

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O0

double __thiscall CholeskyFactor::density(CholeskyFactor *this)

{
  reference pvVar1;
  long in_RDI;
  HighsInt j;
  HighsInt i;
  HighsInt num_nz;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_8;
  
  if (*(int *)(in_RDI + 0x18) == 0) {
    local_8 = 0.0;
  }
  else {
    local_14 = 0;
    for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x18); local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x18); local_1c = local_1c + 1) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                            (long)(local_18 * *(int *)(in_RDI + 0x1c) + local_1c));
        if (1e-07 < ABS(*pvVar1)) {
          local_14 = local_14 + 1;
        }
      }
    }
    local_8 = (double)local_14 /
              ((double)(*(int *)(in_RDI + 0x18) * (*(int *)(in_RDI + 0x18) + 1)) / 2.0);
  }
  return local_8;
}

Assistant:

double density() {
    if (current_k == 0) {
      return 0.0;
    }

    HighsInt num_nz = 0;
    for (HighsInt i = 0; i < current_k; i++) {
      for (HighsInt j = 0; j < current_k; j++) {
        if (fabs(L[i * current_k_max + j]) > 1e-7) {
          num_nz++;
        }
      }
    }
    return (double)num_nz / (current_k * (current_k + 1) / 2.0);
  }